

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O2

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::ComputePredictedValue
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,CornerIndex corner_id,int *data,int data_id)

{
  pointer pIVar1;
  int *piVar2;
  ulong *puVar3;
  const_reference pvVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  Scalar SVar12;
  Scalar SVar13;
  double dVar14;
  double dVar15;
  float fVar16;
  ulong uVar17;
  float fVar18;
  uint uVar19;
  reference rVar20;
  float s;
  VectorD<float,_2> local_b8;
  Self local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Vector2f pn_uv;
  Vector3f tip_pos;
  Vector3f cn;
  Vector3f pn;
  VectorD<float,_3> local_54;
  Vector3f prev_pos;
  Vector3f next_pos;
  
  if (corner_id.value_ == 0xffffffff) {
    uVar19 = 0xffffffff;
    uVar8 = 0xffffffff;
  }
  else {
    uVar19 = corner_id.value_ - 2;
    if ((corner_id.value_ + 1) % 3 != 0) {
      uVar19 = corner_id.value_ + 1;
    }
    if (corner_id.value_ % 3 == 0) {
      uVar8 = corner_id.value_ + 2;
    }
    else {
      uVar8 = corner_id.value_ - 1;
    }
  }
  pIVar1 = (((this->
             super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
             ).mesh_data_.corner_table_)->corner_to_vertex_map_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = pIVar1[uVar8].value_;
  pvVar4 = std::vector<int,_std::allocator<int>_>::at
                     ((this->
                      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                      ).mesh_data_.vertex_to_data_map_,(long)(int)pIVar1[uVar19].value_);
  iVar7 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::at
                     ((this->
                      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                      ).mesh_data_.vertex_to_data_map_,(long)(int)uVar8);
  if ((*pvVar4 < data_id) && (iVar7 < data_id)) {
    local_b0.v_._M_elems[0] = (float)(int)*(undefined8 *)(data + this->num_components_ * iVar7);
    local_b0.v_._M_elems[1] =
         (float)(int)((ulong)*(undefined8 *)(data + this->num_components_ * iVar7) >> 0x20);
    local_b8.v_._M_elems[0] = (float)(int)*(undefined8 *)(data + this->num_components_ * *pvVar4);
    local_b8.v_._M_elems[1] =
         (float)(int)((ulong)*(undefined8 *)(data + this->num_components_ * *pvVar4) >> 0x20);
    if (((local_b8.v_._M_elems[0] != local_b0.v_._M_elems[0]) ||
        (NAN(local_b8.v_._M_elems[0]) || NAN(local_b0.v_._M_elems[0]))) ||
       (local_b8.v_._M_elems[1] != local_b0.v_._M_elems[1])) {
      iVar7 = (int)this;
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                  *)&tip_pos,iVar7);
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                  *)&next_pos,iVar7);
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
                  *)&prev_pos,iVar7);
      VectorD<float,_3>::operator-(&pn,(Self *)&prev_pos);
      VectorD<float,_3>::operator-(&cn,(Self *)&tip_pos);
      SVar12 = VectorD<float,_3>::SquaredNorm(&pn);
      if ((0.0 < SVar12) || (this->version_ < 0x102)) {
        SVar13 = VectorD<float,_3>::Dot(&pn,&cn);
        s = SVar13 / SVar12;
        VectorD<float,_3>::operator*(&local_54,(Scalar *)&pn);
        VectorD<float,_3>::operator-((VectorD<float,_3> *)&pn_uv,&cn);
        SVar13 = VectorD<float,_3>::SquaredNorm((VectorD<float,_3> *)&pn_uv);
        fVar18 = SVar13 / SVar12;
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
      }
      else {
        s = 0.0;
        fVar18 = 0.0;
      }
      VectorD<float,_2>::operator-(&local_b8,&local_b0);
      bVar10 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
               (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      bVar11 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0;
      bVar6 = bVar11 || bVar10;
      if (bVar11 || bVar10) {
        fVar16 = pn_uv.v_._M_elems[1] * fVar18;
        fVar18 = fVar18 * pn_uv.v_._M_elems[0];
        local_a8._0_4_ = s * pn_uv.v_._M_elems[0] + local_b0.v_._M_elems[0];
        local_a8._4_4_ = s * pn_uv.v_._M_elems[1] + local_b0.v_._M_elems[1];
        uStack_a0 = (double)CONCAT44(s * 0.0 + 0.0,s * 0.0 + 0.0);
        rVar20 = std::vector<bool,_std::allocator<bool>_>::back(&this->orientations_);
        uVar17 = *rVar20._M_p;
        std::_Bit_iterator_base::_M_bump_down
                  (&(this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base);
        uVar19 = (uint)((uVar17 & rVar20._M_mask) == 0);
        uVar8 = (int)(uVar19 << 0x1f) >> 0x1f;
        uVar19 = (int)(uVar19 << 0x1f) >> 0x1f;
        fVar18 = (float)(~uVar19 & (uint)fVar18 | (uint)-fVar18 & uVar19) + local_a8._4_4_;
        puVar3 = (ulong *)(this->predicted_value_)._M_t.
                          super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl;
        local_a8 = (double)((float)(~uVar8 & (uint)-fVar16 | (uint)fVar16 & uVar8) + (float)local_a8
                           ) + 0.5;
        uStack_a0 = (double)fVar18 + 0.5;
        dVar14 = floor(local_a8);
        dVar15 = floor(uStack_a0);
        uVar17 = CONCAT44(-(uint)(2147483647.0 < dVar15 || dVar15 < -2147483648.0),
                          -(uint)(2147483647.0 < dVar14 || dVar14 < -2147483648.0));
        *puVar3 = uVar17 & (ulong)DAT_0018e060 | ~uVar17 & CONCAT44((int)dVar15,(int)dVar14);
        return bVar6;
      }
      return bVar6;
    }
    tip_pos.v_._M_elems[0] = 0.0;
    tip_pos.v_._M_elems[1] = 1.4013e-45;
    piVar2 = (this->predicted_value_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
             _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 4) {
      iVar7 = *(int *)((long)tip_pos.v_._M_elems + lVar5);
      fVar18 = local_b8.v_._M_elems[iVar7];
      iVar9 = -0x80000000;
      if (fVar18 <= 2.1474836e+09) {
        iVar9 = (int)fVar18;
      }
      if (NAN(fVar18)) {
        iVar9 = -0x80000000;
      }
      if (fVar18 < -2.1474836e+09) {
        iVar9 = -0x80000000;
      }
      piVar2[iVar7] = iVar9;
    }
  }
  else {
    if (data_id <= iVar7) {
      if (data_id < 1) {
        piVar2 = (this->predicted_value_)._M_t.
                 super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        for (lVar5 = 0; lVar5 < this->num_components_; lVar5 = lVar5 + 1) {
          piVar2[lVar5] = 0;
        }
        return true;
      }
      iVar7 = data_id + -1;
    }
    iVar9 = this->num_components_;
    iVar7 = iVar7 * iVar9;
    piVar2 = (this->predicted_value_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
             _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    for (lVar5 = 0; lVar5 < iVar9; lVar5 = lVar5 + 1) {
      piVar2[lVar5] = data[iVar7 + lVar5];
      iVar9 = this->num_components_;
    }
  }
  return true;
}

Assistant:

bool MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT, MeshDataT>::
    ComputePredictedValue(CornerIndex corner_id, const DataTypeT *data,
                          int data_id) {
  // Compute the predicted UV coordinate from the positions on all corners
  // of the processed triangle. For the best prediction, the UV coordinates
  // on the next/previous corners need to be already encoded/decoded.
  const CornerIndex next_corner_id =
      this->mesh_data().corner_table()->Next(corner_id);
  const CornerIndex prev_corner_id =
      this->mesh_data().corner_table()->Previous(corner_id);
  // Get the encoded data ids from the next and previous corners.
  // The data id is the encoding order of the UV coordinates.
  int next_data_id, prev_data_id;

  int next_vert_id, prev_vert_id;
  next_vert_id =
      this->mesh_data().corner_table()->Vertex(next_corner_id).value();
  prev_vert_id =
      this->mesh_data().corner_table()->Vertex(prev_corner_id).value();

  next_data_id = this->mesh_data().vertex_to_data_map()->at(next_vert_id);
  prev_data_id = this->mesh_data().vertex_to_data_map()->at(prev_vert_id);

  if (prev_data_id < data_id && next_data_id < data_id) {
    // Both other corners have available UV coordinates for prediction.
    const Vector2f n_uv = GetTexCoordForEntryId(next_data_id, data);
    const Vector2f p_uv = GetTexCoordForEntryId(prev_data_id, data);
    if (p_uv == n_uv) {
      // We cannot do a reliable prediction on degenerated UV triangles.
      // Technically floats > INT_MAX are undefined, but compilers will
      // convert those values to INT_MIN. We are being explicit here for asan.
      for (const int i : {0, 1}) {
        if (std::isnan(p_uv[i]) || static_cast<double>(p_uv[i]) > INT_MAX ||
            static_cast<double>(p_uv[i]) < INT_MIN) {
          predicted_value_[i] = INT_MIN;
        } else {
          predicted_value_[i] = static_cast<int>(p_uv[i]);
        }
      }
      return true;
    }

    // Get positions at all corners.
    const Vector3f tip_pos = GetPositionForEntryId(data_id);
    const Vector3f next_pos = GetPositionForEntryId(next_data_id);
    const Vector3f prev_pos = GetPositionForEntryId(prev_data_id);
    // Use the positions of the above triangle to predict the texture coordinate
    // on the tip corner C.
    // Convert the triangle into a new coordinate system defined by orthogonal
    // bases vectors S, T, where S is vector prev_pos - next_pos and T is an
    // perpendicular vector to S in the same plane as vector the
    // tip_pos - next_pos.
    // The transformed triangle in the new coordinate system is then going to
    // be represented as:
    //
    //        1 ^
    //          |
    //          |
    //          |   C
    //          |  /  \
    //          | /      \
    //          |/          \
    //          N--------------P
    //          0              1
    //
    // Where next_pos point (N) is at position (0, 0), prev_pos point (P) is
    // at (1, 0). Our goal is to compute the position of the tip_pos point (C)
    // in this new coordinate space (s, t).
    //
    const Vector3f pn = prev_pos - next_pos;
    const Vector3f cn = tip_pos - next_pos;
    const float pn_norm2_squared = pn.SquaredNorm();
    // Coordinate s of the tip corner C is simply the dot product of the
    // normalized vectors |pn| and |cn| (normalized by the length of |pn|).
    // Since both of these vectors are normalized, we don't need to perform the
    // normalization explicitly and instead we can just use the squared norm
    // of |pn| as a denominator of the resulting dot product of non normalized
    // vectors.
    float s, t;
    // |pn_norm2_squared| can be exactly 0 when the next_pos and prev_pos are
    // the same positions (e.g. because they were quantized to the same
    // location).
    if (version_ < DRACO_BITSTREAM_VERSION(1, 2) || pn_norm2_squared > 0) {
      s = pn.Dot(cn) / pn_norm2_squared;
      // To get the coordinate t, we can use formula:
      //      t = |C-N - (P-N) * s| / |P-N|
      // Do not use std::sqrt to avoid changes in the bitstream.
      t = sqrt((cn - pn * s).SquaredNorm() / pn_norm2_squared);
    } else {
      s = 0;
      t = 0;
    }

    // Now we need to transform the point (s, t) to the texture coordinate space
    // UV. We know the UV coordinates on points N and P (N_UV and P_UV). Lets
    // denote P_UV - N_UV = PN_UV. PN_UV is then 2 dimensional vector that can
    // be used to define transformation from the normalized coordinate system
    // to the texture coordinate system using a 3x3 affine matrix M:
    //
    //  M = | PN_UV[0]  -PN_UV[1]  N_UV[0] |
    //      | PN_UV[1]   PN_UV[0]  N_UV[1] |
    //      | 0          0         1       |
    //
    // The predicted point C_UV in the texture space is then equal to
    // C_UV = M * (s, t, 1). Because the triangle in UV space may be flipped
    // around the PN_UV axis, we also need to consider point C_UV' = M * (s, -t)
    // as the prediction.
    const Vector2f pn_uv = p_uv - n_uv;
    const float pnus = pn_uv[0] * s + n_uv[0];
    const float pnut = pn_uv[0] * t;
    const float pnvs = pn_uv[1] * s + n_uv[1];
    const float pnvt = pn_uv[1] * t;
    Vector2f predicted_uv;
    if (orientations_.empty()) {
      return false;
    }

    // When decoding the data, we already know which orientation to use.
    const bool orientation = orientations_.back();
    orientations_.pop_back();
    if (orientation) {
      predicted_uv = Vector2f(pnus - pnvt, pnvs + pnut);
    } else {
      predicted_uv = Vector2f(pnus + pnvt, pnvs - pnut);
    }
    if (std::is_integral<DataTypeT>::value) {
      // Round the predicted value for integer types.
      // Technically floats > INT_MAX are undefined, but compilers will
      // convert those values to INT_MIN. We are being explicit here for asan.
      const double u = floor(predicted_uv[0] + 0.5);
      if (std::isnan(u) || u > INT_MAX || u < INT_MIN) {
        predicted_value_[0] = INT_MIN;
      } else {
        predicted_value_[0] = static_cast<int>(u);
      }
      const double v = floor(predicted_uv[1] + 0.5);
      if (std::isnan(v) || v > INT_MAX || v < INT_MIN) {
        predicted_value_[1] = INT_MIN;
      } else {
        predicted_value_[1] = static_cast<int>(v);
      }
    } else {
      predicted_value_[0] = static_cast<int>(predicted_uv[0]);
      predicted_value_[1] = static_cast<int>(predicted_uv[1]);
    }

    return true;
  }
  // Else we don't have available textures on both corners. For such case we
  // can't use positions for predicting the uv value and we resort to delta
  // coding.
  int data_offset = 0;
  if (prev_data_id < data_id) {
    // Use the value on the previous corner as the prediction.
    data_offset = prev_data_id * num_components_;
  }
  if (next_data_id < data_id) {
    // Use the value on the next corner as the prediction.
    data_offset = next_data_id * num_components_;
  } else {
    // None of the other corners have a valid value. Use the last encoded value
    // as the prediction if possible.
    if (data_id > 0) {
      data_offset = (data_id - 1) * num_components_;
    } else {
      // We are encoding the first value. Predict 0.
      for (int i = 0; i < num_components_; ++i) {
        predicted_value_[i] = 0;
      }
      return true;
    }
  }
  for (int i = 0; i < num_components_; ++i) {
    predicted_value_[i] = data[data_offset + i];
  }
  return true;
}